

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::Parser::Deserialize(Parser *this,Schema *schema)

{
  vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_> *namespaces;
  bool bVar1;
  bool bVar2;
  int32_t iVar3;
  AdvancedFeatures AVar4;
  String *pSVar5;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar6;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *pVVar7;
  StructDef *pSVar8;
  StructDef *pSVar9;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *pVVar10;
  Vector<flatbuffers::Offset<reflection::Enum>,_unsigned_int> *pVVar11;
  Namespace *pNVar12;
  EnumDef *this_00;
  Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int> *pVVar13;
  Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int> *pVVar14;
  ServiceDef *this_01;
  Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *pVVar15;
  Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *pVVar16;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar17;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar18;
  _Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
  *this_02;
  uint8_t *offset_location_10;
  ulong uVar19;
  uint8_t *offset_location;
  uint8_t *offset_location_5;
  allocator<char> local_ca;
  allocator<char> local_c9;
  string qualified_name;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  SymbolTable<flatbuffers::StructDef> *local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  namespaces_index;
  string local_50;
  
  pSVar5 = reflection::Schema::file_ident(schema);
  if (pSVar5 == (String *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&qualified_name,"",&local_c9);
  }
  else {
    pSVar5 = reflection::Schema::file_ident(schema);
    String::str_abi_cxx11_(&qualified_name,pSVar5);
  }
  std::__cxx11::string::operator=((string *)&this->file_identifier_,(string *)&qualified_name);
  std::__cxx11::string::~string((string *)&qualified_name);
  pSVar5 = reflection::Schema::file_ext(schema);
  if (pSVar5 == (String *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&qualified_name,"",&local_ca);
  }
  else {
    pSVar5 = reflection::Schema::file_ext(schema);
    String::str_abi_cxx11_(&qualified_name,pSVar5);
  }
  std::__cxx11::string::operator=((string *)&this->file_extension_,(string *)&qualified_name);
  std::__cxx11::string::~string((string *)&qualified_name);
  namespaces_index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &namespaces_index._M_t._M_impl.super__Rb_tree_header._M_header;
  namespaces_index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  namespaces_index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  namespaces_index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  namespaces_index._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       namespaces_index._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pVVar6 = reflection::Schema::objects(schema);
  local_88 = &this->structs_;
  do {
    pVVar6 = pVVar6 + 4;
    pVVar7 = reflection::Schema::objects(schema);
    if (pVVar6 == pVVar7 + (ulong)(uint)(*(int *)pVVar7 << 2) + 4) {
      pVVar10 = reflection::Schema::enums(schema);
      goto LAB_001185cf;
    }
    pSVar8 = (StructDef *)operator_new(0x148);
    StructDef::StructDef(pSVar8);
    iVar3 = reflection::Object::bytesize((Object *)(pVVar6 + *(uint *)pVVar6));
    pSVar8->bytesize = (long)iVar3;
    bVar1 = reflection::Object::is_struct((Object *)(pVVar6 + *(uint *)pVVar6));
    pSVar8->fixed = bVar1;
    iVar3 = reflection::Object::minalign((Object *)(pVVar6 + *(uint *)pVVar6));
    pSVar8->minalign = (long)iVar3;
    pSVar5 = reflection::Object::name((Object *)(pVVar6 + *(uint *)pVVar6));
    String::str_abi_cxx11_(&qualified_name,pSVar5);
    bVar1 = SymbolTable<flatbuffers::StructDef>::Add(local_88,&qualified_name,pSVar8);
    std::__cxx11::string::~string((string *)&qualified_name);
    if (bVar1) {
      StructDef::~StructDef(pSVar8);
      uVar19 = 0x148;
      goto LAB_00118790;
    }
    pSVar9 = (StructDef *)operator_new(0x20);
    (pSVar9->super_Definition).name._M_dataplus._M_p = (pointer)0xf;
    (pSVar9->super_Definition).name._M_string_length = (size_type)pSVar8;
    (pSVar9->super_Definition).name.field_2._M_allocated_capacity = 0;
    *(undefined2 *)((long)&(pSVar9->super_Definition).name.field_2 + 8) = 0;
    pSVar5 = reflection::Object::name((Object *)(pVVar6 + *(uint *)pVVar6));
    String::str_abi_cxx11_(&qualified_name,pSVar5);
    bVar1 = SymbolTable<flatbuffers::Type>::Add(&this->types_,&qualified_name,(Type *)pSVar9);
    std::__cxx11::string::~string((string *)&qualified_name);
    pSVar8 = pSVar9;
  } while (!bVar1);
  goto LAB_00118695;
LAB_001186d9:
  pVVar6 = pVVar6 + 4;
  pVVar7 = reflection::Schema::objects(schema);
  if (pVVar6 == pVVar7 + (ulong)(uint)(*(int *)pVVar7 << 2) + 4) goto LAB_001187b5;
  pSVar5 = reflection::Object::name((Object *)(pVVar6 + *(uint *)pVVar6));
  String::str_abi_cxx11_(&qualified_name,pSVar5);
  pSVar8 = SymbolTable<flatbuffers::StructDef>::Lookup(local_88,&qualified_name);
  pNVar12 = anon_unknown_0::GetNamespace(&qualified_name,namespaces,&namespaces_index);
  (pSVar8->super_Definition).defined_namespace = pNVar12;
  bVar1 = StructDef::Deserialize(pSVar8,this,(Object *)(pVVar6 + *(uint *)pVVar6));
  if (!bVar1) goto LAB_00118a82;
  pVVar7 = (Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *)
           reflection::Schema::root_table(schema);
  if (pVVar6 + *(uint *)pVVar6 == pVVar7) {
    this->root_struct_def_ = pSVar8;
  }
  std::__cxx11::string::~string((string *)&qualified_name);
  goto LAB_001186d9;
LAB_001187b5:
  pVVar10 = reflection::Schema::enums(schema);
  do {
    pVVar10 = pVVar10 + 4;
    pVVar11 = reflection::Schema::enums(schema);
    if (pVVar10 == pVVar11 + (ulong)(uint)(*(int *)pVVar11 << 2) + 4) {
      pVVar13 = reflection::Schema::services(schema);
      if (pVVar13 == (Vector<flatbuffers::Offset<reflection::Service>,_unsigned_int> *)0x0)
      goto LAB_00118937;
      pVVar13 = reflection::Schema::services(schema);
      goto LAB_00118887;
    }
    pSVar5 = reflection::Enum::name((Enum *)(pVVar10 + *(uint *)pVVar10));
    String::str_abi_cxx11_(&qualified_name,pSVar5);
    this_00 = SymbolTable<flatbuffers::EnumDef>::Lookup(&this->enums_,&qualified_name);
    pNVar12 = anon_unknown_0::GetNamespace(&qualified_name,namespaces,&namespaces_index);
    (this_00->super_Definition).defined_namespace = pNVar12;
    bVar2 = EnumDef::Deserialize(this_00,this,(Enum *)(pVVar10 + *(uint *)pVVar10));
    std::__cxx11::string::~string((string *)&qualified_name);
    bVar1 = false;
  } while (bVar2);
  goto LAB_00118797;
LAB_00118887:
  pVVar13 = pVVar13 + 4;
  pVVar14 = reflection::Schema::services(schema);
  if (pVVar13 != pVVar14 + (ulong)(uint)(*(int *)pVVar14 << 2) + 4) {
    pSVar5 = reflection::Service::name((Service *)(pVVar13 + *(uint *)pVVar13));
    String::str_abi_cxx11_(&qualified_name,pSVar5);
    this_01 = (ServiceDef *)operator_new(0x110);
    memset(this_01,0,0x110);
    ServiceDef::ServiceDef(this_01);
    pNVar12 = anon_unknown_0::GetNamespace(&qualified_name,namespaces,&namespaces_index);
    (this_01->super_Definition).defined_namespace = pNVar12;
    bVar1 = ServiceDef::Deserialize(this_01,this,(Service *)(pVVar13 + *(uint *)pVVar13));
    if ((bVar1) &&
       (bVar1 = SymbolTable<flatbuffers::ServiceDef>::Add(&this->services_,&qualified_name,this_01),
       !bVar1)) goto code_r0x00118926;
    ServiceDef::~ServiceDef(this_01);
    operator_delete(this_01,0x110);
LAB_00118a82:
    std::__cxx11::string::~string((string *)&qualified_name);
    goto LAB_00118795;
  }
LAB_00118937:
  AVar4 = reflection::Schema::advanced_features(schema);
  this->advanced_features_ = (ulong)AVar4;
  pVVar15 = reflection::Schema::fbs_files(schema);
  bVar1 = true;
  if (pVVar15 != (Vector<flatbuffers::Offset<reflection::SchemaFile>,_unsigned_int> *)0x0) {
    pVVar15 = reflection::Schema::fbs_files(schema);
    while( true ) {
      pVVar16 = reflection::Schema::fbs_files(schema);
      pVVar15 = pVVar15 + 4;
      if (pVVar15 == pVVar16 + (ulong)(uint)(*(int *)pVVar16 << 2) + 4) break;
      pVVar17 = reflection::SchemaFile::included_filenames
                          ((SchemaFile *)(pVVar15 + *(uint *)pVVar15));
      while( true ) {
        pVVar17 = pVVar17 + 4;
        pVVar18 = reflection::SchemaFile::included_filenames
                            ((SchemaFile *)(pVVar15 + *(uint *)pVVar15));
        if (pVVar17 == pVVar18 + (ulong)(uint)(*(int *)pVVar18 << 2) + 4) break;
        qualified_name._M_dataplus._M_p = (pointer)&qualified_name.field_2;
        qualified_name._M_string_length = 0;
        qualified_name.field_2._M_local_buf[0] = '\0';
        local_a8._M_p = (pointer)&local_98;
        local_a0 = 0;
        local_98._M_local_buf[0] = '\0';
        String::str_abi_cxx11_(&local_50,(String *)(pVVar17 + *(uint *)pVVar17));
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pSVar5 = reflection::SchemaFile::filename((SchemaFile *)(pVVar15 + *(uint *)pVVar15));
        String::str_abi_cxx11_(&local_50,pSVar5);
        this_02 = (_Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                     ::operator[](&this->files_included_per_file_,&local_50);
        std::
        _Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
        ::_M_insert_unique<flatbuffers::IncludedFile_const&>
                  (this_02,(IncludedFile *)&qualified_name);
        std::__cxx11::string::~string((string *)&local_50);
        IncludedFile::~IncludedFile((IncludedFile *)&qualified_name);
      }
    }
    bVar1 = true;
  }
  goto LAB_00118797;
code_r0x00118926:
  std::__cxx11::string::~string((string *)&qualified_name);
  goto LAB_00118887;
  while( true ) {
    pSVar9 = (StructDef *)operator_new(0x20);
    (pSVar9->super_Definition).name._M_dataplus._M_p = (pointer)0x10;
    (pSVar9->super_Definition).name._M_string_length = 0;
    *(StructDef **)&(pSVar9->super_Definition).name.field_2 = pSVar8;
    *(undefined2 *)((long)&(pSVar9->super_Definition).name.field_2 + 8) = 0;
    pSVar5 = reflection::Enum::name((Enum *)(pVVar10 + *(uint *)pVVar10));
    String::str_abi_cxx11_(&qualified_name,pSVar5);
    bVar1 = SymbolTable<flatbuffers::Type>::Add(&this->types_,&qualified_name,(Type *)pSVar9);
    std::__cxx11::string::~string((string *)&qualified_name);
    pSVar8 = pSVar9;
    if (bVar1) break;
LAB_001185cf:
    pVVar10 = pVVar10 + 4;
    pVVar11 = reflection::Schema::enums(schema);
    if (pVVar10 == pVVar11 + (ulong)(uint)(*(int *)pVVar11 << 2) + 4) {
      pVVar6 = reflection::Schema::objects(schema);
      namespaces = &this->namespaces_;
      goto LAB_001186d9;
    }
    pSVar8 = (StructDef *)operator_new(0x138);
    EnumDef::EnumDef((EnumDef *)pSVar8);
    pSVar5 = reflection::Enum::name((Enum *)(pVVar10 + *(uint *)pVVar10));
    String::str_abi_cxx11_(&qualified_name,pSVar5);
    bVar1 = SymbolTable<flatbuffers::EnumDef>::Add(&this->enums_,&qualified_name,(EnumDef *)pSVar8);
    std::__cxx11::string::~string((string *)&qualified_name);
    if (bVar1) {
      EnumDef::~EnumDef((EnumDef *)pSVar8);
      uVar19 = 0x138;
      goto LAB_00118790;
    }
  }
LAB_00118695:
  uVar19 = 0x20;
LAB_00118790:
  operator_delete(pSVar8,uVar19);
LAB_00118795:
  bVar1 = false;
LAB_00118797:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  ::~_Rb_tree(&namespaces_index._M_t);
  return bVar1;
}

Assistant:

bool Parser::Deserialize(const reflection::Schema *schema) {
  file_identifier_ = schema->file_ident() ? schema->file_ident()->str() : "";
  file_extension_ = schema->file_ext() ? schema->file_ext()->str() : "";
  std::map<std::string, Namespace *> namespaces_index;

  // Create defs without deserializing so references from fields to structs and
  // enums can be resolved.
  for (auto it = schema->objects()->begin(); it != schema->objects()->end();
       ++it) {
    auto struct_def = new StructDef();
    struct_def->bytesize = it->bytesize();
    struct_def->fixed = it->is_struct();
    struct_def->minalign = it->minalign();
    if (structs_.Add(it->name()->str(), struct_def)) {
      delete struct_def;
      return false;
    }
    auto type = new Type(BASE_TYPE_STRUCT, struct_def, nullptr);
    if (types_.Add(it->name()->str(), type)) {
      delete type;
      return false;
    }
  }
  for (auto it = schema->enums()->begin(); it != schema->enums()->end(); ++it) {
    auto enum_def = new EnumDef();
    if (enums_.Add(it->name()->str(), enum_def)) {
      delete enum_def;
      return false;
    }
    auto type = new Type(BASE_TYPE_UNION, nullptr, enum_def);
    if (types_.Add(it->name()->str(), type)) {
      delete type;
      return false;
    }
  }

  // Now fields can refer to structs and enums by index.
  for (auto it = schema->objects()->begin(); it != schema->objects()->end();
       ++it) {
    std::string qualified_name = it->name()->str();
    auto struct_def = structs_.Lookup(qualified_name);
    struct_def->defined_namespace =
        GetNamespace(qualified_name, namespaces_, namespaces_index);
    if (!struct_def->Deserialize(*this, *it)) { return false; }
    if (schema->root_table() == *it) { root_struct_def_ = struct_def; }
  }
  for (auto it = schema->enums()->begin(); it != schema->enums()->end(); ++it) {
    std::string qualified_name = it->name()->str();
    auto enum_def = enums_.Lookup(qualified_name);
    enum_def->defined_namespace =
        GetNamespace(qualified_name, namespaces_, namespaces_index);
    if (!enum_def->Deserialize(*this, *it)) { return false; }
  }

  if (schema->services()) {
    for (auto it = schema->services()->begin(); it != schema->services()->end();
         ++it) {
      std::string qualified_name = it->name()->str();
      auto service_def = new ServiceDef();
      service_def->defined_namespace =
          GetNamespace(qualified_name, namespaces_, namespaces_index);
      if (!service_def->Deserialize(*this, *it) ||
          services_.Add(qualified_name, service_def)) {
        delete service_def;
        return false;
      }
    }
  }
  advanced_features_ = schema->advanced_features();

  if (schema->fbs_files())
    for (auto s = schema->fbs_files()->begin(); s != schema->fbs_files()->end();
         ++s) {
      for (auto f = s->included_filenames()->begin();
           f != s->included_filenames()->end(); ++f) {
        IncludedFile included_file;
        included_file.filename = f->str();
        files_included_per_file_[s->filename()->str()].insert(included_file);
      }
    }

  return true;
}